

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O1

void installMethodsInClass
               (Class cls,SparseArray *methods_to_replace,SparseArray *methods,BOOL replaceExisting)

{
  dtable_t pSVar1;
  BOOL BVar2;
  uint in_EAX;
  _InitializingDtable *p_Var3;
  objc_method *method;
  undefined8 in_R8;
  dtable_t dtable;
  dtable_t pSVar4;
  uint32_t idx;
  undefined8 uStack_38;
  
  pSVar4 = uninstalled_dtable;
  dtable = (dtable_t)cls->dtable;
  uStack_38._0_4_ = in_EAX;
  if ((dtable_t)cls->dtable == uninstalled_dtable) {
    pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
    pSVar1 = uninstalled_dtable;
    dtable = (dtable_t)cls->dtable;
    p_Var3 = temporary_dtables;
    if (temporary_dtables != (InitializingDtable *)0x0 && dtable == uninstalled_dtable) {
      do {
        if (p_Var3->class == cls) {
          pSVar4 = p_Var3->dtable;
          break;
        }
        p_Var3 = p_Var3->next;
      } while (p_Var3 != (_InitializingDtable *)0x0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
    if ((dtable == pSVar1) && (dtable = pSVar4, pSVar4 != uninstalled_dtable)) {
      objc_sync_enter((id_conflict)cls);
      objc_sync_exit((id_conflict)cls);
    }
  }
  if (uninstalled_dtable == dtable) {
    __assert_fail("uninstalled_dtable != dtable",
                  "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/dtable.c",
                  0x1a6,"void installMethodsInClass(Class, SparseArray *, SparseArray *, BOOL)");
  }
  uStack_38 = (ulong)(uint)uStack_38;
  method = (objc_method *)SparseArrayNext(methods,(uint32_t *)((long)&uStack_38 + 4));
  if (method != (objc_method *)0x0) {
    do {
      if (methods_to_replace != (SparseArray *)0x0) {
        (*(code *)(&DAT_00120588 +
                  *(int *)(&DAT_00120588 +
                          (ulong)(methods_to_replace->shift << 0x1d | methods_to_replace->shift >> 3
                                 ) * 4)))
                  (methods_to_replace,methods_to_replace,methods_to_replace,
                   (method->selector->field_0).name,
                   &DAT_00120588 +
                   *(int *)(&DAT_00120588 +
                           (ulong)(methods_to_replace->shift << 0x1d |
                                  methods_to_replace->shift >> 3) * 4));
        return;
      }
      BVar2 = installMethodInDtable(cls,dtable,method,(objc_method *)0x0,(BOOL)in_R8);
      if (BVar2 == '\0') {
        SparseArrayInsert(methods,uStack_38._4_4_,(void *)0x0);
      }
      method = (objc_method *)SparseArrayNext(methods,(uint32_t *)((long)&uStack_38 + 4));
    } while (method != (objc_method *)0x0);
  }
  return;
}

Assistant:

static void installMethodsInClass(Class cls,
                                  SparseArray *methods_to_replace,
                                  SparseArray *methods,
                                  BOOL replaceExisting)
{
	SparseArray *dtable = dtable_for_class(cls);
	assert(uninstalled_dtable != dtable);

	uint32_t idx = 0;
	struct objc_method *m;
	while ((m = SparseArrayNext(methods, &idx)))
	{
		struct objc_method *method_to_replace = methods_to_replace
			?  SparseArrayLookup(methods_to_replace, m->selector->index)
			: NULL;
		if (!installMethodInDtable(cls, dtable, m, method_to_replace, replaceExisting))
		{
			// Remove this method from the list, if it wasn't actually installed
			SparseArrayInsert(methods, idx, 0);
		}
	}
}